

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O2

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose,int iSigner,cose_errback *perr)

{
  _Bool _Var1;
  int iVar2;
  HCOSE_SIGNER p_Var3;
  bool bVar4;
  
  _Var1 = IsValidSignHandle(cose);
  if (_Var1) {
    p_Var3 = (HCOSE_SIGNER)(cose + 0x58);
    iVar2 = 0;
    if (0 < iSigner) {
      iVar2 = iSigner;
    }
    while( true ) {
      p_Var3 = *(HCOSE_SIGNER *)p_Var3;
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) break;
      if (p_Var3 == (HCOSE_SIGNER)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
        goto LAB_001826cd;
      }
      p_Var3 = p_Var3 + 0x60;
    }
    *(int *)(p_Var3 + 0x10) = *(int *)(p_Var3 + 0x10) + 1;
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
LAB_001826cd:
    p_Var3 = (HCOSE_SIGNER)0x0;
  }
  return p_Var3;
}

Assistant:

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose, int iSigner, cose_errback * perr)
{
	int i;
	COSE_SignerInfo * p;

	if (!IsValidSignHandle(cose)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_HANDLE;
		return NULL;
	}

	p = ((COSE_SignMessage *)cose)->m_signerFirst;
	for (i = 0; i < iSigner; i++) {
		if (p == NULL) {
			if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;
			return NULL;
		}
		p = p->m_signerNext;
	}
	p->m_message.m_refCount++;

	return (HCOSE_SIGNER)p;
}